

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Burst(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  PClassActor *type;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  AActor *pAVar9;
  int iVar10;
  AActor *this;
  char *pcVar11;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_003e5dc1;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e5db1:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e5dc1:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe95,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003e5b74;
    bVar5 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar5) {
      pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e5dc1;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003e5db1;
LAB_003e5b74:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar11 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x03') {
      type = (PClassActor *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (type != (PClassActor *)0x0) {
          bVar5 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
          if (!bVar5) {
            pcVar11 = "chunk == NULL || chunk->IsDescendantOf(RUNTIME_CLASS(AActor))";
            goto LAB_003e5de9;
          }
          (this->Vel).X = 0.0;
          (this->Vel).Y = 0.0;
          (this->Vel).Z = 0.0;
          pAVar9 = AActor::GetDefault(this);
          dVar1 = pAVar9->Height;
          this->Height = dVar1;
          uVar3 = (long)(int)(dVar1 * this->radius) / 0x20;
          uVar4 = 4;
          if (4 < (int)uVar3) {
            uVar4 = uVar3;
          }
          iVar6 = FRandom::Random2(&pr_burst);
          iVar10 = iVar6 % (int)((uVar4 & 0xffffffff) >> 2) + (int)uVar4;
          iVar6 = 0x18;
          if (0x18 < iVar10) {
            iVar6 = iVar10;
          }
          for (; -1 < iVar6; iVar6 = iVar6 + -1) {
            iVar10 = FRandom::operator()(&pr_burst);
            dVar1 = this->radius;
            iVar7 = FRandom::operator()(&pr_burst);
            dVar2 = this->radius;
            iVar8 = FRandom::operator()(&pr_burst);
            AActor::Vec3Offset(&local_48,this,(double)(iVar10 + -0x80) * dVar1 * 0.0078125,
                               (double)(iVar7 + -0x80) * dVar2 * 0.0078125,
                               ((double)iVar8 * this->Height) / 255.0,false);
            pAVar9 = Spawn(type,&local_48,ALLOW_REPLACE);
            if (pAVar9 != (AActor *)0x0) {
              (pAVar9->Vel).Z = (((pAVar9->__Pos).Z - (this->__Pos).Z) * 4.0) / this->Height;
              iVar10 = FRandom::Random2(&pr_burst);
              (pAVar9->Vel).X = (double)iVar10 * 0.0078125;
              iVar10 = FRandom::Random2(&pr_burst);
              (pAVar9->Vel).Y = (double)iVar10 * 0.0078125;
              pAVar9->RenderStyle = this->RenderStyle;
              pAVar9->Alpha = this->Alpha;
              AActor::CopyFriendliness(pAVar9,this,true,true);
            }
          }
          if (((this->flags4).Value & 8) != 0) {
            A_BossDeath(this);
          }
          A_Unblock(this,true);
          (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
        }
        return 0;
      }
      if (type == (PClassActor *)0x0) {
        return 0;
      }
    }
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e5de9:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe96,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burst)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(chunk, AActor);

	int i, numChunks;
	AActor * mo;

	if (chunk == NULL)
	{
		return 0;
	}

	self->Vel.Zero();
	self->Height = self->GetDefault()->Height;

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An self with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int> (4, int(self->radius * self->Height)/32);
	i = (pr_burst.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_burst() - 128) * self->radius / 128;
		double yo = (pr_burst() - 128) * self->radius / 128;
		double zo = (pr_burst() * self->Height / 255);
		mo = Spawn(chunk, self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Vel.Z = 4 * (mo->Z() - self->Z()) / self->Height;
			mo->Vel.X = pr_burst.Random2() / 128.;
			mo->Vel.Y = pr_burst.Random2() / 128.;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
			mo->CopyFriendliness(self, true);
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->Destroy ();
	return 0;
}